

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

void CESkyCoord::Ecliptic2ICRS(CESkyCoord *in_ecliptic,CESkyCoord *out_icrs,CEDate *date)

{
  double dVar1;
  CEAngle CVar2;
  double dec;
  double ra;
  double tt2;
  double tt1;
  double local_f8;
  double local_f0;
  CEAngle local_e8;
  double local_d8;
  double local_d0;
  double local_c8;
  CEAngle local_c0;
  CEDate local_b0;
  CEDate local_70;
  double local_30;
  double local_28;
  
  local_f0 = 0.0;
  local_f8 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  (*date->_vptr_CEDate[5])(date);
  CEDate::UTC2TT((double *)&local_70,&local_28,&local_30);
  local_c8 = local_28;
  local_d0 = local_30;
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar1,JD);
  (*in_ecliptic->_vptr_CESkyCoord[3])(&local_e8,in_ecliptic,&local_70);
  local_d8 = CEAngle::Rad(&local_e8);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_b0,dVar1,JD);
  (*in_ecliptic->_vptr_CESkyCoord[4])(&local_c0,in_ecliptic,&local_b0);
  dVar1 = CEAngle::Rad(&local_c0);
  iauEceq06(local_c8,local_d0,local_d8,SUB84(dVar1,0),&local_f0,&local_f8);
  CEAngle::~CEAngle(&local_c0);
  CEDate::~CEDate(&local_b0);
  CEAngle::~CEAngle(&local_e8);
  CEDate::~CEDate(&local_70);
  CEAngle::Rad((CEAngle *)&local_70,&local_f0);
  CVar2 = CEAngle::Rad((CEAngle *)&local_b0,&local_f8);
  local_e8._vptr_CEAngle._0_4_ = 1;
  (*out_icrs->_vptr_CESkyCoord[5])(CVar2.angle_,out_icrs,&local_70,&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_70);
  return;
}

Assistant:

void CESkyCoord::Ecliptic2ICRS(const CESkyCoord& in_ecliptic,
                               CESkyCoord*       out_icrs,
                               const CEDate&     date)
{
    // Create the variables used for returning ICRS
    double ra(0.0);
    double dec(0.0);

    // Get current time in TT
    double tt1(0.0);
    double tt2(0.0);
    CEDate::UTC2TT(date.MJD(), &tt1, &tt2);

    // Convert ECLIPTIC to ICRS
    iauEceq06(tt1, tt2, 
              in_ecliptic.XCoord().Rad(), in_ecliptic.YCoord().Rad(), 
              &ra, &dec);

    // Set the output ICRS
    out_icrs->SetCoordinates(CEAngle::Rad(ra), CEAngle::Rad(dec),
                             CESkyCoordType::ICRS);
}